

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O3

int Bmc_BmciPerform(Gia_Man_t *p,Vec_Int_t *vInit0,Vec_Int_t *vInit1,int nFrames,int nWords,
                   int nTimeOut,int fVerbose)

{
  char *__s;
  int *piVar1;
  int *piVar2;
  sat_solver *psVar3;
  Gia_Man_t *p_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *__dest;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_01;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  long lVar15;
  abctime aVar16;
  ulong uVar17;
  Vec_Int_t *pVVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  undefined4 uVar22;
  int iLit;
  timespec ts;
  Gia_Man_t *pNew;
  uint local_dc;
  Vec_Int_t *local_d8;
  timespec local_d0;
  Vec_Int_t *local_c0;
  Vec_Int_t *local_b8;
  Vec_Int_t *local_b0;
  sat_solver *local_a8;
  uint local_9c;
  Gia_Man_t *local_98;
  Gia_Man_t *local_90;
  Vec_Int_t *local_88;
  uint local_7c;
  ulong local_78;
  Vec_Int_t *local_70;
  ulong local_68;
  uint local_60;
  undefined4 local_5c;
  long local_58;
  long local_50;
  Gia_Man_t *local_48;
  ulong local_40;
  Cnf_Dat_t *local_38;
  
  local_98 = p;
  local_7c = nFrames;
  if (vInit0->nSize != p->nRegs) {
    __assert_fail("Vec_IntSize(vInit0) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xba,
                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)");
  }
  if (vInit1->nSize != vInit0->nSize) {
    __assert_fail("Vec_IntSize(vInit1) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xbb,
                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)");
  }
  local_a8 = sat_solver_new();
  local_60 = nTimeOut;
  if (nTimeOut == 0) {
    aVar16 = 0;
  }
  else {
    iVar4 = clock_gettime(3,&local_d0);
    if (iVar4 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_d0.tv_nsec / 1000 +
               CONCAT44(local_d0.tv_sec._4_4_,(uint)local_d0.tv_sec) * 1000000;
    }
    aVar16 = lVar15 + (long)nTimeOut * 1000000;
  }
  local_a8->nRuntimeLimit = aVar16;
  local_90 = Gia_ManStart(10000);
  __s = local_98->pName;
  local_48 = local_90;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar7 = strlen(__s);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,__s);
  }
  local_90->pName = __dest;
  Gia_ManHashAlloc(local_90);
  local_98->pObjs->Value = 0;
  iVar4 = local_98->nRegs;
  local_b0 = (Vec_Int_t *)malloc(0x10);
  uVar20 = iVar4 - 1;
  iVar5 = 0x10;
  if (0xe < uVar20) {
    iVar5 = iVar4;
  }
  local_b0->nSize = 0;
  local_b0->nCap = iVar5;
  if (iVar5 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar5 << 2);
  }
  pGVar11 = local_90;
  local_b0->pArray = piVar8;
  if (0 < vInit0->nSize) {
    lVar15 = 0;
    do {
      uVar20 = vInit0->pArray[lVar15];
      local_dc = uVar20;
      if (1 < (int)uVar20) {
        pGVar9 = Gia_ManAppendObj(pGVar11);
        uVar21 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar21 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar21 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pGVar11->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar12 = pGVar11->pObjs;
        if ((pGVar9 < pGVar12) || (pGVar12 + pGVar11->nObjs <= pGVar9)) goto LAB_00572b1e;
        Vec_IntPush(pGVar11->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar12) >> 2) * -0x55555555);
        pGVar12 = pGVar11->pObjs;
        if ((pGVar9 < pGVar12) || (pGVar12 + pGVar11->nObjs <= pGVar9)) goto LAB_00572b1e;
        uVar20 = (int)((ulong)((long)pGVar9 - (long)pGVar12) >> 2) * 0x55555556;
      }
      Vec_IntPush(local_b0,uVar20);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vInit0->nSize);
    iVar4 = local_98->nRegs;
    uVar20 = iVar4 - 1;
  }
  local_b8 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < uVar20) {
    iVar5 = iVar4;
  }
  local_b8->nSize = 0;
  local_b8->nCap = iVar5;
  if (iVar5 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar5 << 2);
  }
  pGVar11 = local_90;
  local_b8->pArray = piVar8;
  if (0 < vInit1->nSize) {
    lVar15 = 0;
    do {
      uVar20 = vInit1->pArray[lVar15];
      local_dc = uVar20;
      if (1 < (int)uVar20) {
        pGVar9 = Gia_ManAppendObj(pGVar11);
        uVar21 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar21 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar21 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pGVar11->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar12 = pGVar11->pObjs;
        if ((pGVar9 < pGVar12) || (pGVar12 + pGVar11->nObjs <= pGVar9)) {
LAB_00572b1e:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pGVar11->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar12) >> 2) * -0x55555555);
        pGVar12 = pGVar11->pObjs;
        if ((pGVar9 < pGVar12) || (pGVar12 + pGVar11->nObjs <= pGVar9)) goto LAB_00572b1e;
        uVar20 = (int)((ulong)((long)pGVar9 - (long)pGVar12) >> 2) * 0x55555556;
      }
      Vec_IntPush(local_b8,uVar20);
      lVar15 = lVar15 + 1;
    } while (lVar15 < vInit1->nSize);
  }
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar10->pArray = piVar8;
  local_d8 = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar10->pArray = piVar8;
  local_88 = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar10->pArray = piVar8;
  local_c0 = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar10->pArray = piVar8;
  local_70 = pVVar10;
  if ((int)local_7c < 1) {
    iVar4 = 1;
    pVVar18 = local_88;
    pVVar10 = local_c0;
  }
  else {
    local_68 = 1;
    local_78 = 0;
    do {
      iVar4 = clock_gettime(3,&local_d0);
      p_00 = local_98;
      pVVar10 = local_b0;
      if (iVar4 < 0) {
        local_58 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_d0.tv_nsec),8);
        local_58 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) +
                   CONCAT44(local_d0.tv_sec._4_4_,(uint)local_d0.tv_sec) * -1000000;
      }
      Bmc_BmciUnfold(pGVar11,local_98,local_b0,0);
      pGVar11 = local_48;
      pVVar18 = local_b8;
      Bmc_BmciUnfold(local_48,p_00,local_b8,1);
      iVar4 = pVVar10->nSize;
      lVar15 = (long)iVar4;
      if (iVar4 != pVVar18->nSize) {
        __assert_fail("Vec_IntSize(vLits0) == Vec_IntSize(vLits1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                      ,0xd7,
                      "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                     );
      }
      local_d8->nSize = 0;
      if (iVar4 < 1) {
        uVar22 = 0;
        uVar21 = 0;
        local_9c = 0;
        iVar5 = 0;
        if (local_98->nRegs != 0) goto LAB_00572c73;
      }
      else {
        piVar8 = local_b0->pArray;
        piVar1 = local_b8->pArray;
        lVar19 = 0;
        local_9c = 0;
        do {
          if (lVar15 == lVar19) goto LAB_00572ae0;
          iVar5 = piVar8[lVar19];
          iVar14 = piVar1[lVar19];
          if ((iVar5 < 2 && iVar14 < 2) || (iVar5 == iVar14)) {
            pVVar10 = local_d8;
            Vec_IntPush(local_d8,-1);
          }
          else {
            iVar5 = Gia_ManHashXor(pGVar11,iVar5,iVar14);
            pVVar10 = local_d8;
            Vec_IntPush(local_d8,iVar5);
            local_9c = local_9c + 1;
          }
          lVar19 = lVar19 + 1;
        } while (lVar15 != lVar19);
        uVar20 = local_d8->nSize;
        uVar21 = (ulong)uVar20;
        if (uVar20 != local_98->nRegs) {
LAB_00572c73:
          __assert_fail("Vec_IntSize(vMiters) == Gia_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                        ,0xdf,
                        "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                       );
        }
        uVar22 = (undefined4)CONCAT71((int7)((ulong)pVVar10 >> 8),0 < (int)uVar20);
        if ((int)uVar20 < 1) {
          uVar22 = 0;
          iVar5 = 0;
        }
        else {
          uVar17 = 0;
          iVar5 = 0;
          do {
            iVar5 = iVar5 + local_d8->pArray[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar21 != uVar17);
        }
      }
      pVVar18 = local_88;
      pVVar10 = local_c0;
      if (iVar4 + iVar5 == 0) {
        iVar4 = 1;
        if (fVerbose != 0) {
          printf("Reached a fixed point after %d frames.  \n",(ulong)((int)local_78 + 1));
        }
        goto LAB_005729cd;
      }
      local_90 = pGVar11;
      local_5c = uVar22;
      local_40 = uVar21;
      pGVar11 = Bmc_BmciPart(pGVar11,local_88,local_d8,local_c0,local_70);
      pAig = Gia_ManToAigSimple(pGVar11);
      pAig->nRegs = 0;
      p_01 = Cnf_Derive(pAig,pAig->nObjs[3]);
      Aig_ManStop(pAig);
      iVar4 = pGVar11->nObjs;
      iVar5 = (int)local_68;
      if ((0 < iVar4) && (pGVar11->pObjs != (Gia_Obj_t *)0x0)) {
        piVar8 = p_01->pVarNums;
        lVar19 = 0;
        do {
          iVar14 = piVar8[lVar19];
          if (-1 < iVar14) {
            piVar8[lVar19] = iVar14 + iVar5;
            iVar4 = pGVar11->nObjs;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < iVar4);
      }
      if (0 < p_01->nLiterals) {
        piVar8 = *p_01->pClauses;
        lVar19 = 0;
        do {
          piVar8[lVar19] = piVar8[lVar19] + iVar5 * 2;
          lVar19 = lVar19 + 1;
        } while (lVar19 < p_01->nLiterals);
      }
      uVar20 = iVar5 + p_01->nVars;
      local_50 = lVar15;
      sat_solver_setnvars(local_a8,uVar20);
      lVar15 = 0;
      while (lVar15 < p_01->nClauses) {
        iVar4 = sat_solver_addclause(local_a8,p_01->pClauses[lVar15],p_01->pClauses[lVar15 + 1]);
        lVar15 = lVar15 + 1;
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                        ,0xee,
                        "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                       );
        }
      }
      iVar4 = pGVar11->nRegs;
      pVVar13 = pGVar11->vCis;
      iVar5 = pVVar13->nSize;
      local_68 = (ulong)uVar20;
      if (iVar4 < iVar5) {
        lVar15 = 0;
        local_38 = p_01;
        do {
          psVar3 = local_a8;
          if (iVar5 <= lVar15) goto LAB_00572ae0;
          iVar5 = pVVar13->pArray[lVar15];
          lVar19 = (long)iVar5;
          if ((lVar19 < 0) || (iVar14 = pGVar11->nObjs, iVar14 <= iVar5)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pGVar11->pObjs == (Gia_Obj_t *)0x0) goto LAB_00572653;
          if (pVVar10->nSize <= iVar5) goto LAB_00572ae0;
          iVar5 = pVVar10->pArray[lVar19];
          if (((long)iVar5 < 0) || (local_88->nSize <= iVar5)) goto LAB_00572ae0;
          uVar20 = local_88->pArray[iVar5];
          if (uVar20 != 0xffffffff) {
            if ((int)(uVar20 | p_01->pVarNums[lVar19]) < 0) {
              __assert_fail("iVarA >= 0 && iVarB >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0x16a,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
            }
            uVar6 = p_01->pVarNums[lVar19] * 2;
            local_d0.tv_sec._4_4_ = uVar20 * 2 + 1;
            local_d0.tv_sec._0_4_ = uVar6;
            iVar4 = sat_solver_addclause(local_a8,(lit *)&local_d0,(lit *)&local_d0.tv_nsec);
            if (iVar4 != 0) {
              local_d0.tv_sec._4_4_ = uVar20 * 2;
              local_d0.tv_sec._0_4_ = uVar6 | 1;
              sat_solver_addclause(psVar3,(lit *)&local_d0,(lit *)&local_d0.tv_nsec);
            }
            iVar4 = pGVar11->nRegs;
            pVVar13 = pGVar11->vCis;
            p_01 = local_38;
            pVVar10 = local_c0;
          }
          lVar15 = lVar15 + 1;
          iVar5 = pVVar13->nSize;
          pVVar18 = local_88;
        } while (lVar15 < iVar5 - iVar4);
      }
      iVar14 = pGVar11->nObjs;
      if (0 < iVar14) {
LAB_00572653:
        pGVar12 = pGVar11->pObjs;
        if (pGVar12 != (Gia_Obj_t *)0x0) {
          lVar15 = 0;
          do {
            uVar20 = (uint)*(undefined8 *)pGVar12;
            if ((((uVar20 & 0x9fffffff) == 0x9fffffff) ||
                (-1 < (int)uVar20 && (~uVar20 & 0x1fffffff) != 0)) && (-1 < p_01->pVarNums[lVar15]))
            {
              if ((uVar20 & 0x9fffffff) != 0x9fffffff) {
                if (pVVar10->nSize <= lVar15) goto LAB_00572ae0;
                iVar4 = pVVar10->pArray[lVar15];
                if (((long)iVar4 < 0) || (pVVar18->nSize <= iVar4)) goto LAB_00572ae0;
                if (pVVar18->pArray[iVar4] != -1) {
                  __assert_fail("Gia_ObjIsCi(pObj) || Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, i) ) == -1"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                                ,0xfc,
                                "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                               );
                }
              }
              if (pVVar10->nSize <= lVar15) goto LAB_00572ae0;
              iVar4 = pVVar10->pArray[lVar15];
              if (((long)iVar4 < 0) || (pVVar18->nSize <= iVar4)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              pVVar18->pArray[iVar4] = p_01->pVarNums[lVar15];
              iVar14 = pGVar11->nObjs;
            }
            lVar15 = lVar15 + 1;
            pGVar12 = pGVar12 + 1;
          } while (lVar15 < iVar14);
        }
      }
      lVar15 = local_50;
      Cnf_DataFree(p_01);
      Gia_ManStop(pGVar11);
      uVar20 = 0;
      if ((char)local_5c != '\0') {
        piVar8 = local_d8->pArray;
        uVar21 = local_40 & 0xffffffff;
        uVar17 = 0;
        uVar20 = 0;
        do {
          local_dc = piVar8[uVar17];
          if (local_dc != 0xffffffff) {
            if ((int)local_dc < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            if (pVVar18->nSize <= (int)(local_dc >> 1)) goto LAB_00572ae0;
            if (pVVar18->pArray[local_dc >> 1] < 1) {
              __assert_fail("Vec_IntEntry(vSatMap, Abc_Lit2Var(iLit)) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                            ,0x107,
                            "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                           );
            }
            local_dc = (local_dc & 1) + pVVar18->pArray[local_dc >> 1] * 2;
            iVar4 = sat_solver_solve(local_a8,(lit *)&local_dc,(lit *)&local_d8,0,0,0,0);
            if (iVar4 == -1) {
              if (lVar15 <= (long)uVar17) {
LAB_00572ae0:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              piVar1 = local_b0->pArray;
              iVar4 = piVar1[uVar17];
              piVar2 = local_b8->pArray;
              iVar5 = piVar2[uVar17];
              if ((iVar4 < 2 && iVar5 < 2) || (iVar4 == iVar5)) {
                __assert_fail("(iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                              ,0x118,
                              "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                             );
              }
              if (iVar5 < 2) {
                piVar1[uVar17] = iVar5;
                iVar4 = piVar2[uVar17];
              }
              else {
                piVar2[uVar17] = iVar4;
                iVar5 = piVar1[uVar17];
              }
              if (iVar5 != iVar4) {
                __assert_fail("iLit0 == iLit1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                              ,0x11f,
                              "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                             );
              }
            }
            else {
              if (iVar4 != 1) {
                if (iVar4 != 0) {
                  __assert_fail("status == l_False",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                                ,0x115,
                                "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                               );
                }
                iVar4 = 0;
                printf("Timeout reached after %d seconds.  \n",(ulong)local_60);
                pVVar10 = local_c0;
                goto LAB_005729cd;
              }
              uVar20 = uVar20 + 1;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar21 != uVar17);
      }
      pGVar11 = local_90;
      iVar4 = (int)local_78;
      if (fVerbose != 0) {
        printf("Frame %4d : ",(ulong)(iVar4 + 1));
        printf("Vars =%7d  ",local_68);
        psVar3 = local_a8;
        uVar6 = sat_solver_nclauses(local_a8);
        printf("Clause =%10d  ",(ulong)uVar6);
        uVar6 = sat_solver_nconflicts(psVar3);
        printf("Conflict =%10d  ",(ulong)uVar6);
        printf("AIG =%7d  ",
               (ulong)(uint)(~(pGVar11->vCos->nSize + pGVar11->vCis->nSize) + pGVar11->nObjs));
        printf("Miters =%5d  ",(ulong)local_9c);
        printf("SAT =%5d  ",(ulong)uVar20);
        iVar14 = 3;
        iVar5 = clock_gettime(3,&local_d0);
        if (iVar5 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_d0.tv_nsec / 1000 +
                   CONCAT44(local_d0.tv_sec._4_4_,(uint)local_d0.tv_sec) * 1000000;
        }
        lVar15 = lVar15 + local_58;
        Abc_Print(iVar14,"%s =","Time");
        Abc_Print(iVar14,"%9.2f sec\n",(double)lVar15 / 1000000.0);
      }
      uVar6 = iVar4 + 1;
      uVar21 = (ulong)uVar6;
      if (uVar20 == 0) {
        printf("Reached a fixed point after %d frames.  \n",uVar21);
        iVar4 = 1;
        pVVar10 = local_c0;
        goto LAB_005729cd;
      }
      local_78 = uVar21;
    } while (uVar6 != local_7c);
    iVar4 = 1;
    pVVar10 = local_c0;
  }
LAB_005729cd:
  sat_solver_delete(local_a8);
  Gia_ManStopP(&local_48);
  if (local_b0->pArray != (int *)0x0) {
    free(local_b0->pArray);
  }
  free(local_b0);
  if (local_b8->pArray != (int *)0x0) {
    free(local_b8->pArray);
  }
  free(local_b8);
  if (local_d8->pArray != (int *)0x0) {
    free(local_d8->pArray);
  }
  free(local_d8);
  if (pVVar18->pArray != (int *)0x0) {
    free(pVVar18->pArray);
  }
  free(pVVar18);
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
  }
  free(pVVar10);
  if (local_70->pArray != (int *)0x0) {
    free(local_70->pArray);
  }
  free(local_70);
  return iVar4;
}

Assistant:

int Bmc_BmciPerform( Gia_Man_t * p, Vec_Int_t * vInit0, Vec_Int_t * vInit1, int nFrames, int nWords, int nTimeOut, int fVerbose )
{
    int nSatVars = 1;
    Vec_Int_t * vLits0, * vLits1, * vMiters, * vSatMap, * vPartMap, * vCopies;
    Gia_Man_t * pNew, * pPart;
    Gia_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int iVar0, iVar1, iLit, iLit0, iLit1;
    int i, f, status, nChanges, nMiters, RetValue = 1;
    assert( Vec_IntSize(vInit0) == Gia_ManRegNum(p) );
    assert( Vec_IntSize(vInit1) == Gia_ManRegNum(p) );

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );

    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;

    vLits0 = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vInit0, iLit, i )
        Vec_IntPush( vLits0, iLit < 2 ? iLit : Gia_ManAppendCi(pNew) );

    vLits1 = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vInit1, iLit, i )
        Vec_IntPush( vLits1, iLit < 2 ? iLit : Gia_ManAppendCi(pNew) );

    vMiters  = Vec_IntAlloc( 1000 );
    vSatMap  = Vec_IntAlloc( 1000 );
    vPartMap = Vec_IntAlloc( 1000 );
    vCopies  = Vec_IntAlloc( 1000 );
    for ( f = 0; f < nFrames; f++ )
    {
        abctime clk = Abc_Clock();
        Bmc_BmciUnfold( pNew, p, vLits0, 0 );
        Bmc_BmciUnfold( pNew, p, vLits1, 1 );
        assert( Vec_IntSize(vLits0) == Vec_IntSize(vLits1) );
        nMiters  = 0;
        Vec_IntClear( vMiters );
        Vec_IntForEachEntryTwo( vLits0, vLits1, iLit0, iLit1, i )
            if ( (iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1 )
                Vec_IntPush( vMiters, Gia_ManHashXor(pNew, iLit0, iLit1) ), nMiters++;
            else
                Vec_IntPush( vMiters, -1 );
        assert( Vec_IntSize(vMiters) == Gia_ManRegNum(p) );
        if ( Vec_IntSum(vMiters) + Vec_IntSize(vLits1) == 0 )
        {
            if ( fVerbose )
                printf( "Reached a fixed point after %d frames.  \n", f+1 );
            break;
        }
        // create new part
        pPart = Bmc_BmciPart( pNew, vSatMap, vMiters, vPartMap, vCopies );
        pCnf = Cnf_DeriveGiaRemapped( pPart );
        Cnf_DataLiftGia( pCnf, pPart, nSatVars );
        nSatVars += pCnf->nVars;
        sat_solver_setnvars( pSat, nSatVars );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
        // stitch the clauses
        Gia_ManForEachPi( pPart, pObj, i )
        {
            iVar0 = pCnf->pVarNums[Gia_ObjId(pPart, pObj)];
            iVar1 = Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, Gia_ObjId(pPart, pObj)) );
            if ( iVar1 == -1 )
                continue;
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        // transfer variables
        Gia_ManForEachCand( pPart, pObj, i )
            if ( pCnf->pVarNums[i] >= 0 )
            {
                assert( Gia_ObjIsCi(pObj) || Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, i) ) == -1 );
                Vec_IntWriteEntry( vSatMap, Vec_IntEntry(vPartMap, i), pCnf->pVarNums[i] );
            }
        Cnf_DataFree( pCnf );
        Gia_ManStop( pPart );
        // perform runs
        nChanges = 0;
        Vec_IntForEachEntry( vMiters, iLit, i )
        {
            if ( iLit == -1 )
                continue;
            assert( Vec_IntEntry(vSatMap, Abc_Lit2Var(iLit)) > 0 );
            iLit = Abc_Lit2LitV( Vec_IntArray(vSatMap), iLit );
            status = sat_solver_solve( pSat, &iLit, &iLit + 1, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            if ( status == l_True )
            {
                nChanges++;
                continue;
            }
            if ( status == l_Undef )
            {
                printf( "Timeout reached after %d seconds.  \n", nTimeOut );
                RetValue = 0;
                goto cleanup;
            }
            assert( status == l_False );
            iLit0 = Vec_IntEntry( vLits0, i );
            iLit1 = Vec_IntEntry( vLits1, i );
            assert( (iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1 );
            if ( iLit1 >= 2 )
                Vec_IntWriteEntry( vLits1, i, iLit0 );
            else
                Vec_IntWriteEntry( vLits0, i, iLit1 );
            iLit0 = Vec_IntEntry( vLits0, i );
            iLit1 = Vec_IntEntry( vLits1, i );
            assert( iLit0 == iLit1 );
        }
        if ( fVerbose )
        {
            printf( "Frame %4d : ",     f+1 );
            printf( "Vars =%7d  ",      nSatVars );
            printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
            printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
            printf( "AIG =%7d  ",       Gia_ManAndNum(pNew) );
            printf( "Miters =%5d  ",    nMiters );
            printf( "SAT =%5d  ",       nChanges );
            Abc_PrintTime( 1, "Time",   Abc_Clock() - clk );
        }
        if ( nChanges == 0 )
        {
            printf( "Reached a fixed point after %d frames.  \n", f+1 );
            break;
        }
    }
cleanup:

    sat_solver_delete( pSat );
    Gia_ManStopP( &pNew );
    Vec_IntFree( vLits0 );
    Vec_IntFree( vLits1 );
    Vec_IntFree( vMiters );
    Vec_IntFree( vSatMap );
    Vec_IntFree( vPartMap );
    Vec_IntFree( vCopies );
    return RetValue;
}